

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O0

string * module_for_header(string *__return_storage_ptr__,string *header)

{
  bool bVar1;
  __type _Var2;
  pointer ppVar3;
  reference pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  char local_10a [2];
  char *local_108;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  undefined1 local_f8 [8];
  string module;
  _Self local_d0;
  const_iterator i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  iterator local_38;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  iterator local_28;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_20;
  const_iterator i;
  string *header_local;
  
  i._M_node = (_Base_ptr)header;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&s_header_map_abi_cxx11_,header);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree_const_iterator(&local_20,&local_28);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&s_header_map_abi_cxx11_);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree_const_iterator(&local_30,&local_38);
  bVar1 = std::operator!=(&local_20,&local_30);
  if (bVar1) {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_20);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&ppVar3->second);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_58,(ulong)header);
    bVar1 = std::operator==(&local_58,"libs/");
    std::__cxx11::string::~string((string *)&local_58);
    if (bVar1) {
      std::__cxx11::string::substr((ulong)local_88,(ulong)header);
      std::__cxx11::string::operator=((string *)header,local_88);
      std::__cxx11::string::~string(local_88);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_a8,(ulong)header);
      bVar1 = std::operator==(&local_a8,"test/");
      std::__cxx11::string::~string((string *)&local_a8);
      if (!bVar1) {
        std::__cxx11::string::string((string *)__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      std::__cxx11::string::substr((ulong)&i_1,(ulong)header);
      std::__cxx11::string::operator=((string *)header,(string *)&i_1);
      std::__cxx11::string::~string((string *)&i_1);
    }
    local_d0._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&s_modules_abi_cxx11_);
    while( true ) {
      module.field_2._8_8_ =
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&s_modules_abi_cxx11_);
      bVar1 = std::operator!=(&local_d0,(_Self *)((long)&module.field_2 + 8));
      if (!bVar1) break;
      pbVar4 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_d0);
      std::__cxx11::string::string((string *)local_f8,(string *)pbVar4);
      local_100._M_current = (char *)std::__cxx11::string::begin();
      local_108 = (char *)std::__cxx11::string::end();
      local_10a[1] = 0x7e;
      local_10a[0] = '/';
      std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                (local_100,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )local_108,local_10a + 1,local_10a);
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)&local_130,(ulong)header);
      std::operator+(&local_150,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                     '/');
      _Var2 = std::operator==(&local_130,&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_130);
      if (_Var2) {
        pbVar4 = std::
                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_d0);
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pbVar4);
      }
      std::__cxx11::string::~string((string *)local_f8);
      if (_Var2) {
        return __return_storage_ptr__;
      }
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_d0);
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string module_for_header( std::string header )
{
    {
        std::map<std::string, std::string>::const_iterator i = s_header_map.find( header );

        if( i != s_header_map.end() )
        {
            return i->second;
        }
    }

    if( header.substr( 0, 5 ) == "libs/" )
    {
        header = header.substr( 5 );
    }
    else if( header.substr( 0, 5 ) == "test/" )
    {
        header = header.substr( 5 );
    }
    else
    {
        return std::string();
    }

    for( std::set<std::string>::const_iterator i = s_modules.begin(); i != s_modules.end(); ++i )
    {
        std::string module = *i;
        std::replace( module.begin(), module.end(), '~', '/' );

        if( header.substr( 0, module.size() + 1 ) == module + '/' )
        {
            return *i;
        }
    }

    return std::string();
}